

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparserutils.h
# Opt level: O1

void lunasvg::stripLeadingAndTrailingSpaces(string_view *input)

{
  byte *pbVar1;
  size_t sVar2;
  
  sVar2 = input->_M_len;
  if (sVar2 != 0) {
    pbVar1 = (byte *)input->_M_str;
    do {
      sVar2 = sVar2 - 1;
      if ((0x20 < (ulong)*pbVar1) || ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0)) break;
      input->_M_str = (char *)(pbVar1 + 1);
      input->_M_len = sVar2;
      pbVar1 = pbVar1 + 1;
    } while (sVar2 != 0);
  }
  sVar2 = input->_M_len;
  if (sVar2 != 0) {
    do {
      sVar2 = sVar2 - 1;
      if (0x20 < (ulong)(byte)input->_M_str[sVar2]) {
        return;
      }
      if ((0x100002600U >> ((ulong)(byte)input->_M_str[sVar2] & 0x3f) & 1) == 0) {
        return;
      }
      input->_M_len = sVar2;
    } while (sVar2 != 0);
  }
  return;
}

Assistant:

constexpr void stripLeadingAndTrailingSpaces(std::string_view& input)
{
    stripLeadingSpaces(input);
    stripTrailingSpaces(input);
}